

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O3

Data<2U> *
es::init::singleton<Data<2U>,_es::init::early_initializer,_void,_std::ios_base::Init>::
first_time_get_instance(void)

{
  anon_union_16_2_61a8b2f2_for__u aVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  ostream *poVar4;
  size_t sVar5;
  logic_error *this;
  long *plVar6;
  long *plVar7;
  long lVar8;
  char *__s;
  bool bVar9;
  Init init_object;
  Init local_69;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  std::ios_base::Init::Init(&local_69);
  if ((_ZN2es4initL14clean_up_phaseE_0 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning: initializing at clean up phase - ",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "static T &es::init::singleton<Data<2>>::first_time_get_instance() [T = Data<2>, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
               ,0x98);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  if (singleton_meta_data_node._p == (void *)0x0) {
    if (((byte)singleton_meta_data_node._flags & 1) != 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Error: circular dependency ","");
      plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
      local_48 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (local_48 == plVar7) {
        local_38 = *plVar7;
        lStack_30 = plVar6[3];
        local_48 = &local_38;
      }
      else {
        local_38 = *plVar7;
      }
      local_40 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::logic_error::logic_error(this,(string *)&local_48);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    do {
      LOCK();
      bVar9 = singleton_meta_data_node._lock._spinlock == false;
      if (bVar9) {
        singleton_meta_data_node._lock._spinlock = true;
      }
      UNLOCK();
    } while (bVar9);
    if (singleton_meta_data_node._init_count != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Warning: 1 first_time_get_instance: initializing Singleton, more than once: init_count: "
                 ,0x58);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,
                 "static T &es::init::singleton<Data<2>>::first_time_get_instance() [T = Data<2>, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
                 ,0x98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"singleton meta data: ",0x15);
      poVar4 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," p: ",4);
      poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," init count: ",0xd);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," flags: ",8);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," func name: ",0xc);
      __s = "\'\'";
      if (singleton_meta_data_node._func_name != (char *)0x0) {
        __s = singleton_meta_data_node._func_name;
      }
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    singleton_meta_data_node._flags._0_1_ = (byte)singleton_meta_data_node._flags | 1;
    if (singleton<Data<2u>,es::init::early_initializer,void,std::ios_base::Init>::
        first_time_get_instance()::iCounter == '\0') {
      singleton<Data<2u>,es::init::early_initializer,void,std::ios_base::Init>::
      first_time_get_instance();
    }
    fprintf(_stdout,"Data::ctor %s\n","Data<2>::Data() [V = 2]");
    singleton_meta_data_node._init_count = singleton_meta_data_node._init_count + 1;
    do {
      singleton_meta_data_node._next = (singletons_meta_data *)0x0;
      lVar8 = 0;
      LOCK();
      if ((anon_union_16_2_61a8b2f2_for__u)ZEXT816(0) ==
          static_obj_stack<es::init::singletons_meta_data>::top._u) {
        static_obj_stack<es::init::singletons_meta_data>::top._u =
             (anon_union_16_2_61a8b2f2_for__u)ZEXT816(0);
      }
      else {
        lVar8 = static_obj_stack<es::init::singletons_meta_data>::top._u._8_8_;
        singleton_meta_data_node._next =
             static_obj_stack<es::init::singletons_meta_data>::top._u._0_8_;
      }
      UNLOCK();
      LOCK();
      aVar1._s._seq = lVar8;
      aVar1._s._p = singleton_meta_data_node._next;
      bVar9 = (anon_union_16_2_61a8b2f2_for__u)aVar1._unit ==
              static_obj_stack<es::init::singletons_meta_data>::top._u;
      if (bVar9) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = lVar8 + 1;
        static_obj_stack<es::init::singletons_meta_data>::top._u =
             (anon_union_16_2_61a8b2f2_for__u)(auVar2 << 0x40 | ZEXT816(0x106280));
      }
      UNLOCK();
    } while (!bVar9);
    singleton_meta_data_node._flags._0_1_ = (byte)singleton_meta_data_node._flags & 0xfe;
    singleton_meta_data_node._func_name =
         "static T &es::init::singleton<Data<2>>::first_time_get_instance() [T = Data<2>, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
    ;
    singleton_meta_data_node._p = &_u;
    singleton_meta_data_node._func = active_delete;
    LOCK();
    singleton_meta_data_node._lock._spinlock = false;
    UNLOCK();
  }
  LOCK();
  _get_instance._M_b._M_p = (__base_type)optimized_get_instance;
  UNLOCK();
  std::ios_base::Init::~Init(&local_69);
  return (Data<2U> *)&_u;
}

Assistant:

static T& first_time_get_instance()
    {
        InitT init_object{};  // make sure, one can use the std::cout std::cerr streams from Singletons code

        if constexpr (es::init::verbose_singletons)
        {
            std::cerr << "Info: firstTimeGetInstance: initializing Singleton: " << __PRETTY_FUNCTION__ << " "
                      << singleton_meta_data_node << std::endl;
        }

        if (clean_up_phase)
        {
            std::cerr << "Warning: initializing at clean up phase - " << __PRETTY_FUNCTION__ << std::endl;
        }

        if (!singleton_meta_data_node._p)
        {
            if (singleton_meta_data_node._flags & 0x1U)
            {
                throw std::logic_error(std::string{"Error: circular dependency "} + __PRETTY_FUNCTION__);
            }
            std::lock_guard<tc_spin_lock> guard(singleton_meta_data_node._lock);

            if (!singleton_meta_data_node._p)
            {
                if (singleton_meta_data_node._init_count > 0)
                {
                    std::cerr
                        << "Warning: 1 first_time_get_instance: initializing Singleton, more than once: init_count: "
                        << singleton_meta_data_node._init_count << " - " << __PRETTY_FUNCTION__ << " "
                        << singleton_meta_data_node << std::endl;
                }

                singleton_meta_data_node._flags |= 0x1U;
                static details_static_instances_counting::InstancesCounterZeroActivated<ActionOnZero> iCounter{};
                new (&_u._instance) T{};

                if constexpr (es::init::verbose_singletons)
                {
                    if (singleton_meta_data_node._init_count > 0)
                        std::cerr << "Warning: 2 first_time_get_instance: initializing Singleton, more than once: "
                                     "init_count: "
                                  << singleton_meta_data_node._init_count << " - " << __PRETTY_FUNCTION__ << " "
                                  << singleton_meta_data_node << std::endl;
                }

                singleton_meta_data_node._func      = active_delete;
                singleton_meta_data_node._p         = (void*)&_u._instance;
                singleton_meta_data_node._func_name = __PRETTY_FUNCTION__;
                singleton_meta_data_node._init_count++;
                stack::push(&singleton_meta_data_node);
                singleton_meta_data_node._flags &= ~0x1U;
            }
        }
        _get_instance = optimized_get_instance;

        return _u._instance;
    }